

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

char * show_asm_constraints(dmr_C *C,char *buf,char *sep,asm_constraint_list *list)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_48 [8];
  ptr_list_iter entryiter__;
  asm_constraint *entry;
  asm_constraint_list *list_local;
  char *sep_local;
  char *buf_local;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)list);
  entryiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_48);
  list_local = (asm_constraint_list *)sep;
  sep_local = buf;
  while (entryiter__._16_8_ != 0) {
    iVar1 = sprintf(sep_local,"%s\"%s\"",list_local,*(undefined8 *)(entryiter__._16_8_ + 8));
    sep_local = sep_local + iVar1;
    if (*(long *)entryiter__._16_8_ != 0) {
      pcVar2 = dmrC_show_pseudo(C,*(pseudo_t *)entryiter__._16_8_);
      iVar1 = sprintf(sep_local," (%s)",pcVar2);
      sep_local = sep_local + iVar1;
    }
    if (*(long *)(entryiter__._16_8_ + 0x10) != 0) {
      pcVar2 = dmrC_show_ident(C,*(ident **)(entryiter__._16_8_ + 0x10));
      iVar1 = sprintf(sep_local," [%s]",pcVar2);
      sep_local = sep_local + iVar1;
    }
    list_local = (asm_constraint_list *)anon_var_dwarf_25573;
    entryiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_48);
  }
  return sep_local;
}

Assistant:

static char *show_asm_constraints(struct dmr_C *C, char *buf, const char *sep, struct asm_constraint_list *list)
{
	struct asm_constraint *entry;

	FOR_EACH_PTR(list, entry) {
		buf += sprintf(buf, "%s\"%s\"", sep, entry->constraint);
		if (entry->pseudo)
			buf += sprintf(buf, " (%s)", dmrC_show_pseudo(C, entry->pseudo));
		if (entry->ident)
			buf += sprintf(buf, " [%s]", dmrC_show_ident(C, entry->ident));
		sep = ", ";		
	} END_FOR_EACH_PTR(entry);
	return buf;
}